

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::ConstraintBlockSymbol::serializeTo
          (ConstraintBlockSymbol *this,ASTSerializer *serializer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  Constraint *__n;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __n = getConstraints(this);
  ASTSerializer::write(serializer,0xb,"constraints",(size_t)__n);
  bVar2 = (this->flags).m_bits;
  if (bVar2 != 0) {
    paVar1 = &local_38.field_2;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    local_38._M_dataplus._M_p = (pointer)paVar1;
    if ((bVar2 & 2) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_38,"pure,");
    }
    if ((bVar2 & 4) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_38,"static,");
    }
    if ((bVar2 & 8) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_38,"extern,");
    }
    if ((bVar2 & 0x10) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_38,"explicitExtern,");
    }
    if ((bVar2 & 0x20) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_38,"initial,");
    }
    if ((bVar2 & 0x40) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_38,"extends,");
    }
    if ((char)bVar2 < '\0') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_38,"final,");
    }
    if (local_38._M_string_length != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (&local_38);
    }
    ASTSerializer::write(serializer,5,"flags",(size_t)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != paVar1) {
      operator_delete(local_38._M_dataplus._M_p,
                      CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                               local_38.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void ConstraintBlockSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("constraints", getConstraints());
    if (flags)
        serializer.write("flags", flagsToStr(flags));
}